

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O1

void __thiscall ON_Environment::CImpl::CImpl(CImpl *this,CImpl *src)

{
  (this->m_back_col).field_0.m_color = 0;
  ON_Texture::ON_Texture(&this->m_back_image);
  this->m_back_proj = Planar;
  (this->m_back_col).field_0 = (src->m_back_col).field_0;
  this->m_back_proj = src->m_back_proj;
  ON_Texture::operator=(&this->m_back_image,&src->m_back_image);
  return;
}

Assistant:

ON_Environment::CImpl::CImpl(const CImpl& src)
{
  m_back_col   = src.m_back_col;
  m_back_proj  = src.m_back_proj;
  m_back_image = src.m_back_image;
}